

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compressed_materialization.cpp
# Opt level: O1

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::CompressedMaterialization::GetDecompressExpression
          (CompressedMaterialization *this,
          unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *input,
          LogicalType *result_type,BaseStatistics *stats)

{
  bool bVar1;
  InternalException *this_00;
  pointer *__ptr;
  long *local_58;
  element_type *local_50;
  string local_48;
  
  bVar1 = TypeIsIntegral((stats->type).physical_type_);
  if (bVar1) {
    local_50 = *(element_type **)result_type;
    result_type->id_ = INVALID;
    result_type->physical_type_ = ~INVALID;
    *(undefined6 *)&result_type->field_0x2 = 0;
    GetIntegralDecompress(this,input,(LogicalType *)&local_50,stats);
    if (local_50 != (element_type *)0x0) {
      (*local_50->_vptr_ExtraTypeInfo[1])();
    }
  }
  else {
    if ((stats->type).id_ != VARCHAR) {
      this_00 = (InternalException *)__cxa_allocate_exception(0x10);
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_48,"Type other than integral/string marked for decompression!","")
      ;
      InternalException::InternalException(this_00,&local_48);
      __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    local_58 = *(long **)result_type;
    result_type->id_ = INVALID;
    result_type->physical_type_ = ~INVALID;
    *(undefined6 *)&result_type->field_0x2 = 0;
    GetStringDecompress(this,input,(LogicalType *)&local_58,stats);
    if (local_58 != (long *)0x0) {
      (**(code **)(*local_58 + 8))();
    }
  }
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
}

Assistant:

unique_ptr<Expression> CompressedMaterialization::GetDecompressExpression(unique_ptr<Expression> input,
                                                                          const LogicalType &result_type,
                                                                          const BaseStatistics &stats) {
	const auto &type = result_type;
	if (TypeIsIntegral(type.InternalType())) {
		return GetIntegralDecompress(std::move(input), result_type, stats);
	} else if (type.id() == LogicalTypeId::VARCHAR) {
		return GetStringDecompress(std::move(input), result_type, stats);
	} else {
		throw InternalException("Type other than integral/string marked for decompression!");
	}
}